

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::parseStateVariable(Parser *this)

{
  bool bVar1;
  bool bVar2;
  Allocator *this_00;
  Module *pMVar3;
  Function *f;
  AggregateInitialiserList *o;
  Expression *o_00;
  Identifier *args;
  string_view name_00;
  pool_ptr<soul::heart::Expression> local_128;
  pool_ptr<soul::heart::Expression> local_120;
  char *local_118;
  undefined1 local_110 [8];
  FunctionParseState parseState;
  Role local_c4;
  Variable *local_c0;
  Variable *v;
  string_view local_80;
  undefined1 local_70 [24];
  string local_58;
  Identifier local_38;
  Identifier name;
  Type type;
  bool isExternal;
  Parser *this_local;
  
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"external");
  readValueType((Type *)&name,this);
  this_00 = Program::getAllocator(&this->program);
  readVariableIdentifier_abi_cxx11_((string *)(local_70 + 0x18),this);
  local_38 = Allocator::get<std::__cxx11::string>
                       (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_70 + 0x18));
  std::__cxx11::string::~string((string *)(local_70 + 0x18));
  pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
  local_80 = Identifier::operator_cast_to_basic_string_view(&local_38);
  name_00._M_str = (char *)local_80._M_len;
  name_00._M_len = (size_t)&pMVar3->stateVariables;
  Module::StateVariables::find((StateVariables *)local_70,name_00);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)local_70);
  pool_ptr<soul::heart::Variable>::~pool_ptr((pool_ptr<soul::heart::Variable> *)local_70);
  if (bVar2) {
    Errors::nameInUse<soul::Identifier&>((CompileMessage *)&v,(Errors *)&local_38,args);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&v);
    CompileMessage::~CompileMessage((CompileMessage *)&v);
  }
  pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
  local_c4 = (uint)bVar1 << 2;
  local_c0 = Module::
             allocate<soul::heart::Variable,soul::CodeLocation&,soul::Type&,soul::Identifier&,soul::heart::Variable::Role>
                       (pMVar3,&(this->
                                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                ).location,(Type *)&name,&local_38,&local_c4);
  parseState.currentBlock = (BlockCode *)0x54e52c;
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x54e52c);
  if (bVar1) {
    pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
    f = Module::allocate<soul::heart::Function>(pMVar3);
    FunctionParseState::FunctionParseState((FunctionParseState *)local_110,f);
    local_118 = "(";
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,(TokenType)0x573c42);
    if (bVar1) {
      o = parseInitialiserList(this,(FunctionParseState *)local_110,(Type *)&name);
      pool_ptr<soul::heart::Expression>::pool_ptr<soul::heart::AggregateInitialiserList,void>
                (&local_120,o);
      (local_c0->initialValue).object = local_120.object;
      pool_ptr<soul::heart::Expression>::~pool_ptr(&local_120);
    }
    else {
      o_00 = parseExpression(this,(FunctionParseState *)local_110);
      pool_ptr<soul::heart::Expression>::pool_ptr<soul::heart::Expression,void>(&local_128,o_00);
      (local_c0->initialValue).object = local_128.object;
      pool_ptr<soul::heart::Expression>::~pool_ptr(&local_128);
    }
    FunctionParseState::~FunctionParseState((FunctionParseState *)local_110);
  }
  parseAnnotation(this,&local_c0->annotation);
  pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
  Module::StateVariables::add(&pMVar3->stateVariables,local_c0);
  expectSemicolon(this);
  Type::~Type((Type *)&name);
  return;
}

Assistant:

void parseStateVariable()
    {
        bool isExternal = matchIf ("external");
        auto type = readValueType();
        auto name = program.getAllocator().get (readVariableIdentifier());

        if (module->stateVariables.find (name))
            throwError (Errors::nameInUse (name));

        auto& v = module->allocate<heart::Variable> (location, type, name,
                                                     isExternal ? heart::Variable::Role::external
                                                                : heart::Variable::Role::state);

        if (matchIf (HEARTOperator::assign))
        {
            FunctionParseState parseState (module->allocate<heart::Function>());

            if (matches (HEARTOperator::openParen))
                v.initialValue = parseInitialiserList (parseState, type);
            else
                v.initialValue = parseExpression (parseState);
        }

        parseAnnotation (v.annotation);

        module->stateVariables.add (v);
        expectSemicolon();
    }